

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_motion.c
# Opt level: O0

int32_t add_param_offset(int param_index,int32_t param_value,int32_t offset)

{
  uint uVar1;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  int is_one_centered;
  int param_type;
  int clamp_vals [2];
  int scale_vals [2];
  bool local_25;
  int local_1c [5];
  int local_8;
  
  local_1c[2] = 10;
  local_1c[3] = 1;
  local_1c[0] = 0x1000;
  local_1c[1] = 0x1000;
  uVar1 = (uint)(1 < in_EDI);
  local_25 = in_EDI == 2 || in_EDI == 5;
  local_8 = in_EDX + ((int)(in_ESI + (uint)local_25 * -0x10000) >>
                     ((byte)local_1c[(long)(int)uVar1 + 2] & 0x1f));
  local_8 = clamp(local_8,-local_1c[(int)uVar1],local_1c[(int)uVar1]);
  return (1 << ((byte)local_1c[(long)(int)uVar1 + 2] & 0x1f)) * local_8 + (uint)local_25 * 0x10000;
}

Assistant:

static int32_t add_param_offset(int param_index, int32_t param_value,
                                int32_t offset) {
  const int scale_vals[2] = { GM_TRANS_PREC_DIFF, GM_ALPHA_PREC_DIFF };
  const int clamp_vals[2] = { GM_TRANS_MAX, GM_ALPHA_MAX };
  // type of param: 0 - translation, 1 - affine
  const int param_type = (param_index < 2 ? 0 : 1);
  const int is_one_centered = (param_index == 2 || param_index == 5);

  // Make parameter zero-centered and offset the shift that was done to make
  // it compatible with the warped model
  param_value = (param_value - (is_one_centered << WARPEDMODEL_PREC_BITS)) >>
                scale_vals[param_type];
  // Add desired offset to the rescaled/zero-centered parameter
  param_value += offset;
  // Clamp the parameter so it does not overflow the number of bits allotted
  // to it in the bitstream
  param_value = (int32_t)clamp(param_value, -clamp_vals[param_type],
                               clamp_vals[param_type]);
  // Rescale the parameter to WARPEDMODEL_PRECISION_BITS so it is compatible
  // with the warped motion library
  param_value *= (1 << scale_vals[param_type]);

  // Undo the zero-centering step if necessary
  return param_value + (is_one_centered << WARPEDMODEL_PREC_BITS);
}